

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O3

uint32_t spvVersionForTargetEnv(spv_target_env env)

{
  uint32_t uVar1;
  
  uVar1 = 0x10000;
  switch(env) {
  case SPV_ENV_UNIVERSAL_1_0:
  case SPV_ENV_VULKAN_1_0:
  case SPV_ENV_OPENCL_2_1:
  case SPV_ENV_OPENGL_4_0:
  case SPV_ENV_OPENGL_4_1:
  case SPV_ENV_OPENGL_4_2:
  case SPV_ENV_OPENGL_4_3:
  case SPV_ENV_OPENGL_4_5:
  case SPV_ENV_OPENCL_1_2:
  case SPV_ENV_OPENCL_EMBEDDED_1_2:
  case SPV_ENV_OPENCL_2_0:
  case SPV_ENV_OPENCL_EMBEDDED_2_0:
  case SPV_ENV_OPENCL_EMBEDDED_2_1:
    break;
  case SPV_ENV_UNIVERSAL_1_1:
    uVar1 = 0x10100;
    break;
  case SPV_ENV_OPENCL_2_2:
  case SPV_ENV_UNIVERSAL_1_2:
  case SPV_ENV_OPENCL_EMBEDDED_2_2:
    uVar1 = 0x10200;
    break;
  case SPV_ENV_UNIVERSAL_1_3:
  case SPV_ENV_VULKAN_1_1:
    uVar1 = 0x10300;
    break;
  case SPV_ENV_WEBGPU_0:
    __assert_fail("false && \"Deprecated target environment value.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/spirv_target_env.cpp"
                  ,0x71,"uint32_t spvVersionForTargetEnv(spv_target_env)");
  case SPV_ENV_UNIVERSAL_1_4:
  case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
    uVar1 = 0x10400;
    break;
  case SPV_ENV_UNIVERSAL_1_5:
  case SPV_ENV_VULKAN_1_2:
    uVar1 = 0x10500;
    break;
  case SPV_ENV_UNIVERSAL_1_6:
  case SPV_ENV_VULKAN_1_3:
    uVar1 = 0x10600;
    break;
  case SPV_ENV_MAX:
    __assert_fail("false && \"Invalid target environment value.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/spirv_target_env.cpp"
                  ,0x7d,"uint32_t spvVersionForTargetEnv(spv_target_env)");
  default:
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint32_t spvVersionForTargetEnv(spv_target_env env) {
  switch (env) {
    case SPV_ENV_UNIVERSAL_1_0:
    case SPV_ENV_VULKAN_1_0:
    case SPV_ENV_OPENCL_1_2:
    case SPV_ENV_OPENCL_EMBEDDED_1_2:
    case SPV_ENV_OPENCL_2_0:
    case SPV_ENV_OPENCL_EMBEDDED_2_0:
    case SPV_ENV_OPENCL_2_1:
    case SPV_ENV_OPENCL_EMBEDDED_2_1:
    case SPV_ENV_OPENGL_4_0:
    case SPV_ENV_OPENGL_4_1:
    case SPV_ENV_OPENGL_4_2:
    case SPV_ENV_OPENGL_4_3:
    case SPV_ENV_OPENGL_4_5:
      return SPV_SPIRV_VERSION_WORD(1, 0);
    case SPV_ENV_UNIVERSAL_1_1:
      return SPV_SPIRV_VERSION_WORD(1, 1);
    case SPV_ENV_UNIVERSAL_1_2:
    case SPV_ENV_OPENCL_2_2:
    case SPV_ENV_OPENCL_EMBEDDED_2_2:
      return SPV_SPIRV_VERSION_WORD(1, 2);
    case SPV_ENV_UNIVERSAL_1_3:
    case SPV_ENV_VULKAN_1_1:
      return SPV_SPIRV_VERSION_WORD(1, 3);
    case SPV_ENV_WEBGPU_0:
      assert(false && "Deprecated target environment value.");
      break;
    case SPV_ENV_UNIVERSAL_1_4:
    case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
      return SPV_SPIRV_VERSION_WORD(1, 4);
    case SPV_ENV_UNIVERSAL_1_5:
    case SPV_ENV_VULKAN_1_2:
      return SPV_SPIRV_VERSION_WORD(1, 5);
    case SPV_ENV_UNIVERSAL_1_6:
    case SPV_ENV_VULKAN_1_3:
      return SPV_SPIRV_VERSION_WORD(1, 6);
    case SPV_ENV_MAX:
      assert(false && "Invalid target environment value.");
      break;
  }
  return SPV_SPIRV_VERSION_WORD(0, 0);
}